

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disp.hpp
# Opt level: O0

emptyness_t __thiscall
so_5::disp::thread_pool::impl::work_thread_details::
work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>
::process_queue(work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::no_activity_tracking_impl_t>
                *this,agent_queue_t *queue)

{
  execution_demand_t *this_00;
  pop_result_t pVar1;
  execution_demand_t *d;
  pop_result_t pop_result;
  size_t demands_processed;
  agent_queue_t *queue_local;
  work_thread_template_t<so_5::disp::thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>
  *this_local;
  
  pop_result.m_continuation = enabled;
  pop_result.m_emptyness = empty;
  do {
    this_00 = agent_queue_t::front(queue);
    no_activity_tracking_impl_t::work_started((no_activity_tracking_impl_t *)this);
    execution_demand_t::call_handler(this_00,(current_thread_id_t)*(native_handle_type *)(this + 8))
    ;
    no_activity_tracking_impl_t::work_finished((no_activity_tracking_impl_t *)this);
    pop_result = (pop_result_t)((long)pop_result + 1);
    pVar1 = agent_queue_t::pop(queue,(size_t)pop_result);
    d._0_4_ = pVar1.m_continuation;
  } while ((processing_continuation_t)d == enabled);
  d._4_4_ = pVar1.m_emptyness;
  return d._4_4_;
}

Assistant:

agent_queue_t::emptyness_t
		process_queue( agent_queue_t & queue )
			{
				std::size_t demands_processed = 0;
				agent_queue_t::pop_result_t pop_result;

				do
					{
						auto & d = queue.front();

						this->work_started();

						d.call_handler( this->m_thread_id );

						this->work_finished();

						++demands_processed;
						pop_result = queue.pop( demands_processed );
					}
				while( agent_queue_t::processing_continuation_t::enabled ==
						pop_result.m_continuation );

				return pop_result.m_emptyness;
			}